

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.cpp
# Opt level: O1

idx_t __thiscall
duckdb::StringSplitter::Split<duckdb::RegularStringSplit>
          (StringSplitter *this,string_t input,string_t delim,StringSplitInput *state,void *data)

{
  bool bVar1;
  idx_t split_size;
  idx_t match_size;
  ulong needle_size;
  idx_t haystack_size;
  idx_t list_idx;
  uchar *haystack;
  uchar *needle;
  undefined8 local_50;
  uchar *local_48;
  undefined8 local_40;
  uchar *local_38;
  
  local_48 = delim.value._0_8_;
  local_50 = input.value._8_8_;
  local_38 = input.value._0_8_;
  haystack_size = (ulong)this & 0xffffffff;
  haystack = local_38;
  if (haystack_size < 0xd) {
    haystack = (uchar *)((long)&local_40 + 4);
  }
  needle_size = (ulong)input.value._8_4_;
  needle = local_48;
  if (needle_size < 0xd) {
    needle = (uchar *)((long)&local_50 + 4);
  }
  list_idx = 0;
  local_40 = this;
  do {
    if (haystack_size == 0) {
      haystack_size = 0;
      break;
    }
    if (needle_size == 0) {
      split_size = 0;
    }
    else {
      split_size = FindStrInStr(haystack,haystack_size,needle,needle_size);
    }
    if ((haystack_size < split_size) ||
       ((split_size == 0 && needle_size == 0 && (split_size = 1, haystack_size == 1)))) {
      bVar1 = false;
    }
    else {
      StringSplitInput::AddSplit(delim.value._8_8_,(char *)haystack,split_size,list_idx);
      list_idx = list_idx + 1;
      haystack = haystack + split_size + needle_size;
      haystack_size = haystack_size - (split_size + needle_size);
      bVar1 = true;
    }
  } while (bVar1);
  StringSplitInput::AddSplit(delim.value._8_8_,(char *)haystack,haystack_size,list_idx);
  return list_idx + 1;
}

Assistant:

static idx_t Split(string_t input, string_t delim, StringSplitInput &state, void *data) {
		auto input_data = input.GetData();
		auto input_size = input.GetSize();
		auto delim_data = delim.GetData();
		auto delim_size = delim.GetSize();
		idx_t list_idx = 0;
		while (input_size > 0) {
			idx_t match_size = 0;
			auto pos = OP::Find(input_data, input_size, delim_data, delim_size, match_size, data);
			if (pos > input_size) {
				break;
			}
			if (match_size == 0 && pos == 0) {
				// special case: 0 length match and pos is 0
				// move to the next character
				for (pos++; pos < input_size; pos++) {
					if (IsCharacter(input_data[pos])) {
						break;
					}
				}
				if (pos == input_size) {
					break;
				}
			}
			D_ASSERT(input_size >= pos + match_size);
			state.AddSplit(input_data, pos, list_idx);

			list_idx++;
			input_data += (pos + match_size);
			input_size -= (pos + match_size);
		}
		state.AddSplit(input_data, input_size, list_idx);
		list_idx++;
		return list_idx;
	}